

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * aux_upvalue(StkId fi,int n,TValue **val,GCObject **owner)

{
  GCObject *pGVar1;
  lua_CFunction p_Var2;
  long lVar3;
  uint uVar4;
  StkId local_60;
  Proto *p;
  TString *name;
  LClosure *f_1;
  CClosure *f;
  GCObject **owner_local;
  TValue **val_local;
  int n_local;
  StkId fi_local;
  
  uVar4 = fi->tt_ & 0x3f;
  if (uVar4 == 6) {
    p_Var2 = (fi->value_).f;
    lVar3 = *(long *)(p_Var2 + 0x18);
    if ((n < 1) || (*(int *)(lVar3 + 0x50) < n)) {
      fi_local = (StkId)0x0;
    }
    else {
      *val = *(TValue **)(*(long *)(p_Var2 + (long)(n + -1) * 8 + 0x20) + 0x10);
      if (owner != (GCObject **)0x0) {
        *owner = *(GCObject **)(p_Var2 + (long)(n + -1) * 8 + 0x20);
      }
      lVar3 = *(long *)(*(long *)(lVar3 + 0x38) + (long)(n + -1) * 0x10);
      if (lVar3 == 0) {
        local_60 = (StkId)0x12fc41;
      }
      else {
        local_60 = (StkId)(lVar3 + 0x18);
      }
      fi_local = local_60;
    }
  }
  else if (uVar4 == 0x26) {
    pGVar1 = (GCObject *)(fi->value_).f;
    if ((n < 1) || ((int)(uint)(pGVar1->h).flags < n)) {
      fi_local = (StkId)0x0;
    }
    else {
      *val = (TValue *)((long)pGVar1 + (long)(n + -1) * 0x10 + 0x20);
      if (owner != (GCObject **)0x0) {
        *owner = pGVar1;
      }
      fi_local = (StkId)0x12fc41;
    }
  }
  else {
    fi_local = (StkId)0x0;
  }
  return (char *)fi_local;
}

Assistant:

static const char *aux_upvalue (StkId fi, int n, TValue **val,
                                GCObject **owner) {
  switch (ttype(fi)) {
    case LUA_TCCL: {  /* C closure */
      CClosure *f = clCvalue(fi);
      if (!(1 <= n && n <= f->nupvalues)) return NULL;
      *val = &f->upvalue[n-1];
      if (owner) *owner = obj2gco(f);
      return "";
    }
    case LUA_TLCL: {  /* Lua closure */
      LClosure *f = clLvalue(fi);
      TString *name;
      Proto *p = f->p;
      if (!(1 <= n && n <= p->sizeupvalues)) return NULL;
      *val = f->upvals[n-1]->v;
      if (owner) *owner = obj2gco(f->upvals[n - 1]);
      name = p->upvalues[n-1].name;
      return (name == NULL) ? "" : getstr(name);
    }
    default: return NULL;  /* not a closure */
  }
}